

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void tcu::anon_unknown_0::decompressEAC_R11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  ulong src_00;
  int i;
  long lVar4;
  long lVar5;
  ushort uVar6;
  deUint8 *pdVar7;
  deUint8 uncompressedBlock [32];
  deUint8 local_48 [40];
  
  pdVar7 = local_48;
  pvVar2 = (dst->super_ConstPixelBufferAccess).m_data;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  lVar4 = 0;
  src_00 = 0;
  do {
    src_00 = (ulong)src[lVar4] | src_00 << 8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  EtcDecompressInternal::decompressEAC11Block(local_48,src_00,signedMode);
  iVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      if (signedMode) {
        uVar6 = *(ushort *)(pdVar7 + lVar5 * 2);
        if ((short)uVar6 < 0) {
          uVar6 = -((ushort)((-(uint)uVar6 & 0xffff) >> 6) | uVar6 * -0x20);
        }
        else {
          uVar6 = uVar6 >> 6 | uVar6 << 5;
        }
      }
      else {
        uVar6 = *(ushort *)(pdVar7 + lVar5 * 2) >> 6 | *(ushort *)(pdVar7 + lVar5 * 2) << 5;
      }
      *(ushort *)((long)pvVar2 + lVar5 * 2 + (long)iVar3) = uVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    iVar3 = iVar3 + iVar1;
    pdVar7 = pdVar7 + 8;
  } while (lVar4 != 4);
  return;
}

Assistant:

void decompressEAC_R11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_R11;

	const deUint64	compressedBlock = get64BitBlock(src, 0);
	deUint8			uncompressedBlock[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlock, compressedBlock, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_R11 == 2);

			if (signedMode)
			{
				const deInt16* const	srcPixel = (deInt16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel = (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixel[0]);
			}
			else
			{
				const deUint16* const	srcPixel = (deUint16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel = (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixel[0]);
			}
		}
	}
}